

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::IsTextureCase::init
          (IsTextureCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  RequiredExtensions extensions;
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_58;
  UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> local_38;
  ContextType local_24;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_20;
  
  local_38.m_data.ptr = glu::ContextInfo::create(this->m_renderCtx);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20._M_impl.super__Vector_impl_data._M_start._0_4_ =
       (*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = isCoreTextureTarget((ContextType *)&local_20,this->m_target);
  if (!bVar1) {
    local_24.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getTextureTargetExtension((RequiredExtensions *)&local_20,&local_24,this->m_target);
    RequiredExtensions::add((RequiredExtensions *)&local_58,(RequiredExtensions *)&local_20);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_20);
  }
  RequiredExtensions::check((RequiredExtensions *)&local_58,local_38.m_data.ptr);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_58);
  de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniqueBase
            (&local_38);
  return extraout_EAX;
}

Assistant:

void IsTextureCase::init (void)
{
	const de::UniquePtr<glu::ContextInfo>	ctxInfo		(glu::ContextInfo::create(m_renderCtx));
	RequiredExtensions						extensions;

	// target
	if (!isCoreTextureTarget(m_renderCtx.getType(), m_target))
		extensions.add(getTextureTargetExtension(m_renderCtx.getType(), m_target));

	extensions.check(*ctxInfo);
}